

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

void af_cjk_metrics_init_widths(AF_CJKMetrics metrics,FT_Face face)

{
  uint uVar1;
  FT_Error FVar2;
  long lVar3;
  ulong local_ab60;
  FT_Pos stdw;
  AF_CJKAxis axis_1;
  FT_Pos dist;
  AF_Segment_conflict pAStack_ab38;
  FT_UInt num_widths;
  AF_Segment_conflict link;
  AF_Segment_conflict limit;
  AF_Segment_conflict seg;
  AF_AxisHints axhints;
  AF_CJKAxis axis;
  char *pcStack_ab08;
  uint num_idx;
  char *p;
  void *shaper_buf;
  FT_ULong shaper_buf_;
  AF_ScriptClass script_class;
  AF_StyleClass style_class;
  AF_Scaler scaler;
  AF_CJKMetricsRec dummy [1];
  AF_Dimension local_329c;
  FT_ULong FStack_3298;
  int dim;
  FT_ULong glyph_index;
  undefined1 local_3288 [4];
  FT_Error error;
  AF_GlyphHintsRec hints [1];
  FT_Face face_local;
  AF_CJKMetrics metrics_local;
  
  af_glyph_hints_init((AF_GlyphHints)local_3288,face->memory);
  metrics->axis[0].width_count = 0;
  metrics->axis[1].width_count = 0;
  style_class = (AF_StyleClass)dummy;
  script_class = (AF_ScriptClass)(metrics->root).style_class;
  shaper_buf_ = (FT_ULong)af_script_classes[*(AF_Script *)&script_class->script_uni_ranges];
  p = (char *)&shaper_buf;
  pcStack_ab08 = ((AF_ScriptClass)shaper_buf_)->standard_charstring;
  FStack_3298 = 0;
  do {
    if (*pcStack_ab08 == '\0') break;
    for (; *pcStack_ab08 == ' '; pcStack_ab08 = pcStack_ab08 + 1) {
    }
    pcStack_ab08 = af_shaper_get_cluster(pcStack_ab08,&metrics->root,p,(uint *)((long)&axis + 4));
  } while ((1 < axis._4_4_) ||
          (FStack_3298 = af_shaper_get_elem(&metrics->root,p,0,(FT_Long *)0x0,(FT_Long *)0x0),
          FStack_3298 == 0));
  af_shaper_buf_destroy(face,p);
  if ((FStack_3298 != 0) &&
     (((FStack_3298 != 0 && (FVar2 = FT_Load_Glyph(face,(FT_UInt)FStack_3298,1), FVar2 == 0)) &&
      (0 < (face->glyph->outline).n_points)))) {
    memset(&scaler,0,0x7830);
    dummy[0].root.globals._0_4_ = metrics->units_per_em;
    style_class->script = 0x10000;
    style_class->blue_stringset = AF_BLUE_STRINGSET_ADLM;
    *(undefined8 *)&style_class->coverage = 0x10000;
    style_class[1].writing_system = AF_WRITING_SYSTEM_DUMMY;
    style_class[1].script = AF_SCRIPT_ADLM;
    style_class[1].blue_stringset = AF_BLUE_STRINGSET_ADLM;
    style_class[1].coverage = AF_COVERAGE_PETITE_CAPITALS_FROM_CAPITALS;
    *(FT_Face *)style_class = face;
    style_class[2].style = AF_STYLE_ADLM_DFLT;
    style_class[2].writing_system = AF_WRITING_SYSTEM_DUMMY;
    af_glyph_hints_rescale((AF_GlyphHints)local_3288,(AF_StyleMetrics_conflict)&scaler);
    FVar2 = af_glyph_hints_reload((AF_GlyphHints)local_3288,&face->glyph->outline);
    if (FVar2 == 0) {
      for (local_329c = AF_DIMENSION_HORZ; (int)local_329c < 2;
          local_329c = local_329c + AF_DIMENSION_VERT) {
        axhints = (AF_AxisHints)(metrics->axis + (int)local_329c);
        seg = (AF_Segment_conflict)
              &hints[0].axis[(long)(int)local_329c + -1].embedded.edges[0xb].last;
        dist._4_4_ = 0;
        FVar2 = af_latin_hints_compute_segments((AF_GlyphHints)local_3288,local_329c);
        if (FVar2 != 0) break;
        af_latin_hints_link_segments((AF_GlyphHints)local_3288,0,(AF_WidthRec *)0x0,local_329c);
        limit = *(AF_Segment_conflict *)&seg->max_coord;
        uVar1._0_1_ = seg->flags;
        uVar1._1_1_ = seg->dir;
        uVar1._2_2_ = seg->pos;
        link = limit + uVar1;
        for (; limit < link; limit = limit + 1) {
          pAStack_ab38 = limit->link;
          if (((pAStack_ab38 != (AF_Segment_conflict)0x0) && (pAStack_ab38->link == limit)) &&
             (limit < pAStack_ab38)) {
            axis_1 = (AF_CJKAxis)(long)((int)limit->pos - (int)pAStack_ab38->pos);
            if ((long)axis_1 < 0) {
              axis_1 = (AF_CJKAxis)-(long)axis_1;
            }
            if (dist._4_4_ < 0x10) {
              *(AF_CJKAxis *)((long)(axhints->embedded).segments + (ulong)dist._4_4_ * 0x18 + -0x10)
                   = axis_1;
              dist._4_4_ = dist._4_4_ + 1;
            }
          }
        }
        af_sort_and_quantize_widths
                  ((FT_UInt *)((long)&dist + 4),(AF_Width)&axhints->edges,
                   (ulong)(FT_UInt)dummy[0].root.globals / 100);
        axhints->num_edges = dist._4_4_;
      }
    }
  }
  for (local_329c = 0; (int)local_329c < 2; local_329c = local_329c + 1) {
    lVar3 = (long)(int)local_329c;
    if (metrics->axis[lVar3].width_count == 0) {
      local_ab60 = ((ulong)metrics->units_per_em * 0x32) / 0x800;
    }
    else {
      local_ab60 = metrics->axis[lVar3].widths[0].org;
    }
    metrics->axis[lVar3].edge_distance_threshold = (long)local_ab60 / 5;
    metrics->axis[lVar3].standard_width = local_ab60;
    metrics->axis[lVar3].extra_light = '\0';
  }
  af_glyph_hints_done((AF_GlyphHints)local_3288);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_cjk_metrics_init_widths( AF_CJKMetrics  metrics,
                              FT_Face        face )
  {
    /* scan the array of segments in each direction */
    AF_GlyphHintsRec  hints[1];


    FT_TRACE5(( "\n" ));
    FT_TRACE5(( "cjk standard widths computation (style `%s')\n",
                af_style_names[metrics->root.style_class->style] ));
    FT_TRACE5(( "===================================================\n" ));
    FT_TRACE5(( "\n" ));

    af_glyph_hints_init( hints, face->memory );

    metrics->axis[AF_DIMENSION_HORZ].width_count = 0;
    metrics->axis[AF_DIMENSION_VERT].width_count = 0;

    {
      FT_Error          error;
      FT_ULong          glyph_index;
      int               dim;
      AF_CJKMetricsRec  dummy[1];
      AF_Scaler         scaler = &dummy->root.scaler;

      AF_StyleClass   style_class  = metrics->root.style_class;
      AF_ScriptClass  script_class = af_script_classes[style_class->script];

      /* If HarfBuzz is not available, we need a pointer to a single */
      /* unsigned long value.                                        */
#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
      void*     shaper_buf;
#else
      FT_ULong  shaper_buf_;
      void*     shaper_buf = &shaper_buf_;
#endif

      const char*  p;

#ifdef FT_DEBUG_LEVEL_TRACE
      FT_ULong  ch = 0;
#endif

      p = script_class->standard_charstring;

#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
      shaper_buf = af_shaper_buf_create( face );
#endif

      /* We check a list of standard characters.  The first match wins. */

      glyph_index = 0;
      while ( *p )
      {
        unsigned int  num_idx;

#ifdef FT_DEBUG_LEVEL_TRACE
        const char*  p_old;
#endif


        while ( *p == ' ' )
          p++;

#ifdef FT_DEBUG_LEVEL_TRACE
        p_old = p;
        GET_UTF8_CHAR( ch, p_old );
#endif

        /* reject input that maps to more than a single glyph */
        p = af_shaper_get_cluster( p, &metrics->root, shaper_buf, &num_idx );
        if ( num_idx > 1 )
          continue;

        /* otherwise exit loop if we have a result */
        glyph_index = af_shaper_get_elem( &metrics->root,
                                          shaper_buf,
                                          0,
                                          NULL,
                                          NULL );
        if ( glyph_index )
          break;
      }

      af_shaper_buf_destroy( face, shaper_buf );

      if ( !glyph_index )
        goto Exit;

      if ( !glyph_index )
        goto Exit;

      FT_TRACE5(( "standard character: U+%04lX (glyph index %ld)\n",
                  ch, glyph_index ));

      error = FT_Load_Glyph( face, glyph_index, FT_LOAD_NO_SCALE );
      if ( error || face->glyph->outline.n_points <= 0 )
        goto Exit;

      FT_ZERO( dummy );

      dummy->units_per_em = metrics->units_per_em;

      scaler->x_scale = 0x10000L;
      scaler->y_scale = 0x10000L;
      scaler->x_delta = 0;
      scaler->y_delta = 0;

      scaler->face        = face;
      scaler->render_mode = FT_RENDER_MODE_NORMAL;
      scaler->flags       = 0;

      af_glyph_hints_rescale( hints, (AF_StyleMetrics)dummy );

      error = af_glyph_hints_reload( hints, &face->glyph->outline );
      if ( error )
        goto Exit;

      for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
      {
        AF_CJKAxis    axis    = &metrics->axis[dim];
        AF_AxisHints  axhints = &hints->axis[dim];
        AF_Segment    seg, limit, link;
        FT_UInt       num_widths = 0;


        error = af_latin_hints_compute_segments( hints,
                                                 (AF_Dimension)dim );
        if ( error )
          goto Exit;

        /*
         * We assume that the glyphs selected for the stem width
         * computation are `featureless' enough so that the linking
         * algorithm works fine without adjustments of its scoring
         * function.
         */
        af_latin_hints_link_segments( hints,
                                      0,
                                      NULL,
                                      (AF_Dimension)dim );

        seg   = axhints->segments;
        limit = seg + axhints->num_segments;

        for ( ; seg < limit; seg++ )
        {
          link = seg->link;

          /* we only consider stem segments there! */
          if ( link && link->link == seg && link > seg )
          {
            FT_Pos  dist;


            dist = seg->pos - link->pos;
            if ( dist < 0 )
              dist = -dist;

            if ( num_widths < AF_CJK_MAX_WIDTHS )
              axis->widths[num_widths++].org = dist;
          }
        }

        /* this also replaces multiple almost identical stem widths */
        /* with a single one (the value 100 is heuristic)           */
        af_sort_and_quantize_widths( &num_widths, axis->widths,
                                     dummy->units_per_em / 100 );
        axis->width_count = num_widths;
      }

    Exit:
      for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
      {
        AF_CJKAxis  axis = &metrics->axis[dim];
        FT_Pos      stdw;


        stdw = ( axis->width_count > 0 ) ? axis->widths[0].org
                                         : AF_LATIN_CONSTANT( metrics, 50 );

        /* let's try 20% of the smallest width */
        axis->edge_distance_threshold = stdw / 5;
        axis->standard_width          = stdw;
        axis->extra_light             = 0;

#ifdef FT_DEBUG_LEVEL_TRACE
        {
          FT_UInt  i;


          FT_TRACE5(( "%s widths:\n",
                      dim == AF_DIMENSION_VERT ? "horizontal"
                                               : "vertical" ));

          FT_TRACE5(( "  %ld (standard)", axis->standard_width ));
          for ( i = 1; i < axis->width_count; i++ )
            FT_TRACE5(( " %ld", axis->widths[i].org ));

          FT_TRACE5(( "\n" ));
        }
#endif
      }
    }

    FT_TRACE5(( "\n" ));

    af_glyph_hints_done( hints );
  }